

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

void __thiscall SkipList::reset(SkipList *this)

{
  Node *pNVar1;
  Node *local_20;
  Node *p;
  Node *t;
  SkipList *this_local;
  
  while (this->head != (Node *)0x0) {
    pNVar1 = this->head;
    this->head = this->head->down;
    while (local_20 = pNVar1, local_20 != (Node *)0x0) {
      pNVar1 = local_20->right;
      if (local_20 != (Node *)0x0) {
        Node::~Node(local_20);
        operator_delete(local_20,0x38);
      }
    }
  }
  pNVar1 = (Node *)operator_new(0x38);
  Node::Node(pNVar1);
  this->head = pNVar1;
  this->length = 0;
  this->valueSize = 0;
  return;
}

Assistant:

void SkipList::reset() {
  while (head) {
    Node *t, *p = head;
    head = head->down;
    while (p) {
      t = p->right;
      delete p;
      p = t;
    }
  }
  head = new Node();
  length = 0;
  valueSize = 0;
}